

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IncompleteCubeSizeCase::IncompleteCubeSizeCase
          (IncompleteCubeSizeCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,IVec2 *size,IVec2 *invalidLevelSize,int invalidLevelNdx)

{
  TexCubeCompletenessCase::TexCubeCompletenessCase
            (&this->super_TexCubeCompletenessCase,testCtx,renderCtx,name,description);
  (this->super_TexCubeCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e13170;
  *(int *)&(this->super_TexCubeCompletenessCase).field_0x84 = invalidLevelNdx;
  tcu::Vector<int,_2>::Vector(&this->m_invalidLevelSize,invalidLevelSize);
  this->m_invalidCubeFace = CUBEFACE_LAST;
  tcu::Vector<int,_2>::Vector(&this->m_size,size);
  return;
}

Assistant:

IncompleteCubeSizeCase::IncompleteCubeSizeCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, IVec2 invalidLevelSize, int invalidLevelNdx)
	: TexCubeCompletenessCase		(testCtx, renderCtx, name, description)
	, m_invalidLevelNdx				(invalidLevelNdx)
	, m_invalidLevelSize			(invalidLevelSize)
	, m_invalidCubeFace				(tcu::CUBEFACE_LAST)
	, m_size						(size)
{
}